

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseSet.h
# Opt level: O2

bool __thiscall SparseSet<0>::insert(SparseSet<0> *this,uint value)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = elem(this,value);
  if (!bVar2) {
    uVar1 = this->members;
    this->sparse[value] = uVar1;
    this->dense[uVar1] = value;
    this->members = this->members + 1;
    return true;
  }
  __assert_fail("!elem(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/adt/SparseSet.h"
                ,0x5a,"virtual bool SparseSet<>::insert(unsigned int) [U = 0]");
}

Assistant:

virtual bool insert(unsigned int value)
  {
    if( U&1 )
    {
      unsigned int old_dense = sparse[value];
      unsigned int lost_val = dense[members];
      
      sparse[value] = members;
      dense[members] = value;
      
      sparse[lost_val] = old_dense;
      dense[old_dense] = lost_val;
    } 
    else 
    {
      assert( !elem(value) );
      
      sparse[value] = members;
      dense[members] = value;
    }
    members++;
    return true;
  }